

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

ssize_t __thiscall
OpenMesh::IO::_PLYReader_::read(_PLYReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  mostream *pmVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 in_register_00000034;
  istream *_in;
  
  _in = (istream *)CONCAT44(in_register_00000034,__fd);
  if (*(int *)(_in + *(long *)(*(long *)_in + -0x18) + 0x20) != 0) {
    pmVar2 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar2->super_ostream,"[PLYReader] : cannot not use stream",0x23);
    std::ios::widen((char)(pmVar2->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar2);
    std::ostream::put((char)pmVar2);
    std::ostream::flush();
    return 0;
  }
  (this->userOptions_).flags_ = *(value_type *)__nbytes;
  *(undefined4 *)__nbytes = 0;
  if ((((this->options_).flags_ & 0x10) != 0) && (((this->userOptions_).flags_ & 0x10) != 0)) {
    *(undefined4 *)__nbytes = 0x10;
  }
  if ((((this->options_).flags_ & 0x40) != 0) && (((this->userOptions_).flags_ & 0x40) != 0)) {
    *(byte *)__nbytes = *(byte *)__nbytes | 0x40;
  }
  if ((((this->options_).flags_ & 0x20) != 0) && (((this->userOptions_).flags_ & 0x20) != 0)) {
    *(byte *)__nbytes = *(byte *)__nbytes | 0x20;
  }
  if ((((this->options_).flags_ & 0x200) != 0) && (((this->userOptions_).flags_ & 0x200) != 0)) {
    *(byte *)(__nbytes + 1) = *(byte *)(__nbytes + 1) | 2;
  }
  if (((this->options_).flags_ & 1) != 0) {
    *(byte *)__nbytes = *(byte *)__nbytes | 1;
  }
  if (((this->options_).flags_ & 0x1000) != 0) {
    *(byte *)(__nbytes + 1) = *(byte *)(__nbytes + 1) | 0x10;
  }
  if ((((this->options_).flags_ & 0x2000) != 0) && (((this->userOptions_).flags_ & 0x2000) != 0)) {
    *(byte *)(__nbytes + 1) = *(byte *)(__nbytes + 1) | 0x20;
  }
  if (((this->options_).flags_ & 1) == 0) {
    bVar1 = read_ascii(this,_in,(BaseImporter *)__buf,(Options *)__nbytes);
    return CONCAT71(extraout_var,bVar1);
  }
  bVar1 = read_binary(this,_in,(BaseImporter *)__buf,false,(Options *)__nbytes);
  return CONCAT71(extraout_var_00,bVar1);
}

Assistant:

bool _PLYReader_::read(std::istream& _in, BaseImporter& _bi, Options& _opt) {

    if (!_in.good()) {
        omerr() << "[PLYReader] : cannot not use stream" << std::endl;
        return false;
    }

    // filter relevant options for reading
    bool swap = _opt.check(Options::Swap);

    userOptions_ = _opt;

    // build options to be returned
    _opt.clear();

    if (options_.vertex_has_normal() && userOptions_.vertex_has_normal()) {
        _opt += Options::VertexNormal;
    }
    if (options_.vertex_has_texcoord() && userOptions_.vertex_has_texcoord()) {
        _opt += Options::VertexTexCoord;
    }
    if (options_.vertex_has_color() && userOptions_.vertex_has_color()) {
        _opt += Options::VertexColor;
    }
    if (options_.face_has_color() && userOptions_.face_has_color()) {
        _opt += Options::FaceColor;
    }
    if (options_.is_binary()) {
        _opt += Options::Binary;
    }
    if (options_.color_is_float()) {
        _opt += Options::ColorFloat;
    }
    if (options_.check(Options::Custom) && userOptions_.check(Options::Custom)) {
        _opt += Options::Custom;
    }

    //    //force user-choice for the alpha value when reading binary
    //    if ( options_.is_binary() && userOptions_.color_has_alpha() )
    //      options_ += Options::ColorAlpha;

    return (options_.is_binary() ? read_binary(_in, _bi, swap, _opt) : read_ascii(_in, _bi, _opt));

}